

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_rollback_all(fdb_file_handle *fhandle,fdb_snapshot_marker_t marker)

{
  __int_type_conflict _Var1;
  fdb_kvs_handle *handle;
  kvs_info *pkVar2;
  filemgr *file;
  bool bVar3;
  fdb_status fVar4;
  fdb_status fVar5;
  fdb_seqnum_t seqnum;
  uint sleep_time;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  void *local_448;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle rhandle;
  fdb_config config;
  snap_handle shandle;
  
  rhandle.log_callback.callback = (fdb_log_callback)0x0;
  rhandle.log_callback.callback_ex = (fdb_log_callback_ex)0x0;
  rhandle.log_callback.ctx_data = (void *)0x0;
  if (fhandle == (fdb_file_handle *)0x0) {
    fVar4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    handle = fhandle->root;
    pkVar2 = handle->kvs;
    if ((pkVar2 == (kvs_info *)0x0) || (bVar3 = _fdb_kvs_is_busy(fhandle), !bVar3)) {
      file = handle->file;
      memcpy(&config,&handle->config,0xf8);
      kvs_config.custom_cmp_param = (handle->kvs_config).custom_cmp_param;
      kvs_config.create_if_missing = (handle->kvs_config).create_if_missing;
      kvs_config._1_7_ = *(undefined7 *)&(handle->kvs_config).field_0x1;
      kvs_config.custom_cmp = (handle->kvs_config).custom_cmp;
      local_448 = (handle->log_callback).ctx_data;
      local_458 = *(undefined4 *)&(handle->log_callback).callback;
      uStack_454 = *(undefined4 *)((long)&(handle->log_callback).callback + 4);
      uStack_450 = *(undefined4 *)&(handle->log_callback).callback_ex;
      uStack_44c = *(undefined4 *)((long)&(handle->log_callback).callback_ex + 4);
      if (((handle->config).flags & 2) == 0) {
        filemgr_mutex_lock(file);
        filemgr_set_rollback(handle->file,'\x01');
        bVar3 = wal_txn_exists(handle->file);
        if (bVar3) {
          filemgr_set_rollback(handle->file,'\0');
          filemgr_mutex_unlock(handle->file);
          fVar4 = FDB_RESULT_FAIL_BY_TRANSACTION;
        }
        else {
          sleep_time = 10000;
          while( true ) {
            _Var1 = (handle->file->status).super___atomic_base<unsigned_char>._M_i;
            filemgr_mutex_unlock(handle->file);
            if (_Var1 != '\x01') break;
            decaying_usleep(&sleep_time,1000000);
            filemgr_mutex_lock(handle->file);
          }
          if (_Var1 == '\x04') {
            fdb_check_file_reopen(handle,(file_status_t *)0x0);
          }
          fdb_sync_db_header(handle);
          fVar4 = wal_shutdown(handle->file,&handle->log_callback);
          if (fVar4 == FDB_RESULT_SUCCESS) {
            memset(&rhandle,0,0x208);
            memset(&shandle,0,0xe0);
            rhandle.log_callback.callback = (fdb_log_callback)CONCAT44(uStack_454,local_458);
            rhandle.log_callback.callback_ex = (fdb_log_callback_ex)CONCAT44(uStack_44c,uStack_450);
            rhandle.log_callback.ctx_data = local_448;
            LOCK();
            UNLOCK();
            rhandle.max_seqnum = 0xffffffffffffffff;
            rhandle.fhandle = fhandle;
            rhandle.last_hdr_bid.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)marker;
            rhandle.shandle = &shandle;
            if (pkVar2 != (kvs_info *)0x0) {
              fdb_kvs_header_free(file);
              rhandle.kvs_config.create_if_missing = kvs_config.create_if_missing;
              rhandle.kvs_config._1_7_ = kvs_config._1_7_;
              rhandle.kvs_config.custom_cmp = kvs_config.custom_cmp;
              rhandle.kvs_config.custom_cmp_param = kvs_config.custom_cmp_param;
              rhandle.kvs = pkVar2;
            }
            memcpy(&rhandle.config,&config,0xf8);
            fVar4 = _fdb_open(&rhandle,file->filename,FDB_AFILENAME,&config);
            if (rhandle.config.multi_kv_instances == true) {
              filemgr_mutex_lock(rhandle.file);
              fdb_kvs_header_create(rhandle.file);
              fdb_kvs_header_read((rhandle.file)->kv_header,rhandle.dhandle,rhandle.kv_info_offset,
                                  (rhandle.file)->version,false);
              filemgr_mutex_unlock(rhandle.file);
            }
            filemgr_set_rollback(file,'\0');
            rhandle.shandle = (snap_handle *)0x0;
            if (fVar4 == FDB_RESULT_SUCCESS) {
              fVar4 = FDB_RESULT_SUCCESS;
              _fdb_restore_wal(&rhandle,FDB_RESTORE_NORMAL,marker,0);
              filemgr_mutex_lock(file);
              seqnum = filemgr_get_seqnum(file);
              filemgr_set_seqnum(file,rhandle.seqnum);
              filemgr_mutex_unlock(file);
              fVar5 = _fdb_commit(&rhandle,'\0',(rhandle.config.durability_opt & 2) == 0);
              if (fVar5 == FDB_RESULT_SUCCESS) {
                _fdb_close(handle);
                _fdb_kvs_handle::operator=(handle,&rhandle);
              }
              else {
                filemgr_mutex_lock(file);
                filemgr_set_seqnum(file,seqnum);
                filemgr_mutex_unlock(file);
                fVar4 = fVar5;
              }
            }
            else {
              fdb_kvs_header_create(file);
              fdb_kvs_header_read(file->kv_header,handle->dhandle,handle->kv_info_offset,
                                  0xdeadcafebeefc002,false);
            }
          }
        }
      }
      else {
        fVar4 = fdb_log_impl(&handle->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                             ,"fdb_rollback_all",0x55c,
                             "Warning: Rollback is not allowed on the read-only DB file \'%s\'.",
                             file->filename);
      }
    }
    else {
      fVar4 = FDB_RESULT_KV_STORE_BUSY;
    }
  }
  return fVar4;
}

Assistant:

LIBFDB_API
fdb_status fdb_rollback_all(fdb_file_handle *fhandle,
                            fdb_snapshot_marker_t marker)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_config config;
    fdb_kvs_handle *super_handle;
    fdb_kvs_handle rhandle;
    fdb_kvs_handle *handle = &rhandle;
    struct filemgr *file;
    fdb_kvs_config kvs_config;
    fdb_status fs;
    err_log_callback log_callback;
    struct kvs_info *kvs;
    struct snap_handle shandle; // dummy snap handle

    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    super_handle = fhandle->root;
    kvs = super_handle->kvs;

    // fdb_rollback_all cannot be allowed when there are kv store instances
    // still open, because we do not have means of invalidating open kv handles
    // which may not be present in the rollback point
    if (kvs && _fdb_kvs_is_busy(fhandle)) {
        return FDB_RESULT_KV_STORE_BUSY;
    }
    file = super_handle->file;
    config = super_handle->config;
    kvs_config = super_handle->kvs_config;
    log_callback = super_handle->log_callback;

    if (super_handle->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&super_handle->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Rollback is not allowed on the read-only DB file '%s'.",
                       super_handle->file->filename);
    }

    filemgr_mutex_lock(super_handle->file);
    filemgr_set_rollback(super_handle->file, 1); // disallow writes operations
    // All transactions should be closed before rollback
    if (wal_txn_exists(super_handle->file)) {
        filemgr_set_rollback(super_handle->file, 0);
        filemgr_mutex_unlock(super_handle->file);
        return FDB_RESULT_FAIL_BY_TRANSACTION;
    }

    // If compaction is running, wait until it is aborted.
    // TODO: Find a better way of waiting for the compaction abortion.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(super_handle->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(super_handle->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(super_handle->file);
        fstatus = filemgr_get_file_status(super_handle->file);
    }
    if (fstatus == FILE_REMOVED_PENDING) {
        filemgr_mutex_unlock(super_handle->file);
        fdb_check_file_reopen(super_handle, NULL);
    } else {
        filemgr_mutex_unlock(super_handle->file);
    }

    fdb_sync_db_header(super_handle);
    // Shutdown WAL discarding entries from all KV Stores..
    fs = wal_shutdown(super_handle->file, &super_handle->log_callback);
    if (fs != FDB_RESULT_SUCCESS) {
        return fs;
    }

    memset(handle, 0, sizeof(fdb_kvs_handle));
    memset(&shandle, 0, sizeof(struct snap_handle));
    handle->log_callback = log_callback;
    handle->fhandle = fhandle;
    // Fast rewind on open...
    atomic_store_uint64_t(&handle->last_hdr_bid, (bid_t)marker);
    handle->max_seqnum = FDB_SNAPSHOT_INMEM; // Prevent WAL restore on open
    handle->shandle = &shandle; // a dummy handle to prevent WAL restore
    if (kvs) {
        fdb_kvs_header_free(file); // KV header will be recreated below.
        handle->kvs = kvs; // re-use super_handle's kvs info
        handle->kvs_config = kvs_config;
    }
    handle->config = config;

    fs = _fdb_open(handle, file->filename, FDB_AFILENAME, &config);

    if (handle->config.multi_kv_instances) {
        filemgr_mutex_lock(handle->file);
        fdb_kvs_header_create(handle->file);
        fdb_kvs_header_read(handle->file->kv_header, handle->dhandle,
                            handle->kv_info_offset,
                            handle->file->version, false);
        filemgr_mutex_unlock(handle->file);
    }

    filemgr_set_rollback(file, 0); // allow mutations
    handle->shandle = NULL; // just a dummy handle never allocated

    if (fs == FDB_RESULT_SUCCESS) {
        fdb_seqnum_t old_seqnum;
        // Restore WAL for all KV instances...
        _fdb_restore_wal(handle, FDB_RESTORE_NORMAL, (bid_t)marker, 0);

        // rollback the file's sequence number
        filemgr_mutex_lock(file);
        old_seqnum = filemgr_get_seqnum(file);
        filemgr_set_seqnum(file, handle->seqnum);
        filemgr_mutex_unlock(file);

        fs = _fdb_commit(handle, FDB_COMMIT_NORMAL,
                         !(handle->config.durability_opt & FDB_DRB_ASYNC));
        if (fs == FDB_RESULT_SUCCESS) {
            _fdb_close(super_handle);
            *super_handle = *handle;
        } else {
            filemgr_mutex_lock(file);
            filemgr_set_seqnum(file, old_seqnum);
            filemgr_mutex_unlock(file);
        }
    } else { // Rollback failed, restore KV header
        fdb_kvs_header_create(file);
        fdb_kvs_header_read(file->kv_header, super_handle->dhandle,
                            super_handle->kv_info_offset,
                            ver_get_latest_magic(),
                            false);
    }

    return fs;
}